

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
mxx::scatter<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int *msgs,size_t size,
                 int root,comm *comm)

{
  size_t size_00;
  size_t msgs_00;
  reference out;
  allocator<int> local_32;
  undefined1 local_31;
  comm *local_30;
  comm *comm_local;
  size_t sStack_20;
  int root_local;
  size_t size_local;
  int *msgs_local;
  vector<int,_std::allocator<int>_> *result;
  
  local_31 = 0;
  local_30 = comm;
  comm_local._4_4_ = root;
  sStack_20 = size;
  size_local = (size_t)msgs;
  msgs_local = (int *)__return_storage_ptr__;
  std::allocator<int>::allocator(&local_32);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,size,&local_32);
  std::allocator<int>::~allocator(&local_32);
  msgs_00 = size_local;
  size_00 = sStack_20;
  out = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,0);
  scatter<int>((int *)msgs_00,size_00,out,comm_local._4_4_,local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> scatter(const T* msgs, size_t size, int root, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result(size);
    scatter(msgs, size, &result[0], root, comm);
    return result;
}